

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsdf.h
# Opt level: O3

bool __thiscall pbrt::BSDF::IsGlossy(BSDF *this)

{
  float fVar1;
  ulong uVar2;
  undefined1 auVar3 [16];
  ushort uVar4;
  uint uVar5;
  BxDFFlags BVar6;
  long lVar7;
  DiffuseBxDF *this_00;
  LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF> *this_01;
  
  uVar2 = (this->bxdf).
          super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
          .bits;
  uVar4 = (ushort)(uVar2 >> 0x30);
  if ((uint)(uVar2 >> 0x31) < 3) {
    uVar5 = (uint)uVar4;
    if (uVar5 < 3) {
      this_00 = (DiffuseBxDF *)(uVar2 & 0xffffffffffff);
      if (uVar5 == 2) {
        BVar6 = DiffuseBxDF::Flags(this_00);
      }
      else {
        fVar1 = (this_00->R).values.values[0];
        BVar6 = Unset;
        if ((fVar1 == 0.0) && (!NAN(fVar1))) {
          lVar7 = -1;
          do {
            if (lVar7 == 2) {
              BVar6 = Unset;
              goto LAB_00475b8f;
            }
            fVar1 = (this_00->R).values.values[lVar7 + 2];
            lVar7 = lVar7 + 1;
          } while ((fVar1 == 0.0) && (!NAN(fVar1)));
          BVar6 = Unset;
        }
      }
    }
    else {
      this_01 = (LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF> *)
                (uVar2 & 0xffffffffffff);
      if (uVar5 - 2 < 2) {
        BVar6 = LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF>::Flags
                          ((LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF> *)
                           this_01);
      }
      else if (uVar5 - 2 == 2) {
        BVar6 = LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF>::Flags(this_01);
      }
      else {
        auVar3 = vminss_avx(ZEXT416((uint)(this_01->top).mfDistrib.alpha_y),
                            ZEXT416((uint)(this_01->top).mfDistrib.alpha_x));
        BVar6 = (uint)(auVar3._0_4_ < 0.001) * 8 + (GlossyTransmission|Reflection);
      }
    }
  }
  else if (uVar4 - 5 < 3) {
    BVar6 = Unset;
    if (uVar4 - 5 == 2) {
      BVar6 = GlossyReflection;
    }
  }
  else {
    BVar6 = GlossyReflection;
    if ((1 < uVar4 - 7) && (BVar6 = Unset, uVar4 - 7 == 2)) {
      auVar3 = vminss_avx(ZEXT416(((uint *)(uVar2 & 0xffffffffffff))[1]),
                          ZEXT416(*(uint *)(uVar2 & 0xffffffffffff)));
      BVar6 = (uint)(auVar3._0_4_ < 0.001) * 8 + GlossyReflection;
    }
  }
LAB_00475b8f:
  return SUB41((BVar6 & Glossy) >> 3,0);
}

Assistant:

PBRT_CPU_GPU
    bool IsGlossy() const { return (bxdf.Flags() & BxDFFlags::Glossy); }